

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

void rtosc::path_search(Ports *root,char *str,char *needle,char *types,size_t max_types,
                       rtosc_arg_t *args,size_t max_args,path_search_opts opts,bool reply_with_query
                       )

{
  Port *pPVar1;
  bool bVar2;
  int iVar3;
  unsigned_long *puVar4;
  Port *pPVar5;
  ulong uVar6;
  size_t sVar7;
  undefined1 *in_RCX;
  char *in_RDX;
  char *in_RSI;
  Ports *in_RDI;
  long in_R8;
  undefined8 *in_R9;
  int in_stack_00000010;
  anon_class_1_0_00000001 is_less_2;
  size_t unused_paths;
  size_t strlen_prev;
  size_t prev_pos;
  size_t n_paths_found;
  anon_class_1_0_00000001 is_less;
  Port *p;
  itr_t __end2;
  itr_t __begin2;
  Ports *__range2;
  anon_class_40_5_2428ddf5 fn;
  Port *port;
  Port *single_port;
  Ports *ports;
  size_t pos;
  size_t max;
  Ports *in_stack_ffffffffffffff08;
  size_t sVar8;
  __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
  *in_stack_ffffffffffffff10;
  Port *in_stack_ffffffffffffff18;
  anon_class_40_5_2428ddf5 *in_stack_ffffffffffffff20;
  long lVar9;
  size_t local_d8;
  ulong local_d0;
  __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
  in_stack_ffffffffffffff60;
  Ports *in_stack_ffffffffffffff68;
  Port *local_60;
  Ports *local_58;
  ulong local_50;
  unsigned_long local_48;
  size_t local_40;
  byte local_31;
  undefined8 *local_30;
  undefined1 *local_20;
  char *local_18;
  char *local_10;
  Ports *local_8;
  
  local_31 = (byte)unused_paths & 1;
  local_18 = in_RDX;
  if (in_RDX == (char *)0x0) {
    local_18 = "";
  }
  local_48 = in_R8 - 1;
  local_30 = in_R9;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  puVar4 = std::min<unsigned_long>(&local_48,(unsigned_long *)&stack0x00000008);
  local_40 = *puVar4;
  local_50 = 0;
  local_58 = (Ports *)0x0;
  local_60 = (Port *)0x0;
  memset(local_20,0,local_40 + 1);
  memset(local_30,0,local_40);
  if ((local_31 & 1) != 0) {
    *local_20 = 0x73;
    *local_30 = local_10;
    local_20[1] = 0x73;
    local_50 = 2;
    local_30[2] = local_18;
  }
  pPVar1 = local_60;
  if ((*local_10 == '\0') || (iVar3 = strcmp(local_10,"/"), iVar3 == 0)) {
    local_58 = local_8;
  }
  else {
    pPVar5 = Ports::apropos(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60._M_current);
    if ((pPVar5 != (Port *)0x0) && (pPVar1 = pPVar5, pPVar5->ports != (Ports *)0x0)) {
      local_58 = pPVar5->ports;
      pPVar1 = local_60;
    }
  }
  local_60 = pPVar1;
  if (local_58 == (Ports *)0x0) {
    if (local_60 != (Port *)0x0) {
      path_search::anon_class_40_5_2428ddf5::operator()
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
  }
  else {
    Ports::begin(in_stack_ffffffffffffff08);
    Ports::end(in_stack_ffffffffffffff08);
    while (bVar2 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffff10,
                              (__normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                               *)in_stack_ffffffffffffff08), bVar2) {
      __gnu_cxx::
      __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
      ::operator*((__normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                   *)&stack0xffffffffffffff60);
      path_search::anon_class_40_5_2428ddf5::operator()
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      __gnu_cxx::
      __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
      ::operator++((__normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                    *)&stack0xffffffffffffff60);
    }
  }
  if ((in_stack_00000010 == 1) || (in_stack_00000010 == 2)) {
    uVar6 = local_50 >> 1;
    std::
    sort<my_array<rtosc_arg_t,2ul>*,rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__1>
              (local_30,local_30 + uVar6 * 4);
    if (in_stack_00000010 == 2) {
      local_d0 = 0;
      if (uVar6 < 2) {
        local_d8 = 0;
      }
      else {
        local_d8 = strlen((char *)*local_30);
      }
      lVar9 = 0;
      for (local_50 = 2; local_50 < uVar6 << 1; local_50 = local_50 + 2) {
        sVar8 = local_d8;
        sVar7 = strlen((char *)local_30[local_50 * 2]);
        if (((sVar8 < sVar7) &&
            (iVar3 = strncmp((char *)local_30[local_50 * 2],(char *)local_30[local_d0 * 2],local_d8)
            , iVar3 == 0)) && (*(char *)(local_30[local_d0 * 2] + (local_d8 - 1)) == '/')) {
          local_30[local_50 * 2] = 0;
          lVar9 = lVar9 + 1;
        }
        else {
          local_d0 = local_50;
          local_d8 = strlen((char *)local_30[local_50 * 2]);
        }
      }
      std::
      sort<my_array<rtosc_arg_t,2ul>*,rtosc::path_search(rtosc::Ports_const&,char_const*,char_const*,char*,unsigned_long,rtosc_arg_t*,unsigned_long,rtosc::path_search_opts,bool)::__2>
                (local_30,local_30 + uVar6 * 4);
      local_20[(uVar6 - lVar9) * 2] = 0;
    }
  }
  return;
}

Assistant:

void rtosc::path_search(const rtosc::Ports& root,
                        const char *str, const char* needle,
                        char *types, std::size_t max_types,
                        rtosc_arg_t* args, std::size_t max_args,
                        path_search_opts opts, bool reply_with_query)
{
    using rtosc::Ports;
    using rtosc::Port;

    if(!needle)
        needle = "";

    // the last char of "types" is being used for a terminating 0
    std::size_t  max         = std::min(max_types - 1, max_args);
    size_t       pos         = 0;
    const Ports *ports       = nullptr;
    const Port  *single_port = nullptr;

    //zero out data
    memset(types, 0, max + 1);
    memset(args,  0, max);

    if(reply_with_query) {
        assert(max >= 2);
        types[pos]    = 's';
        args[pos++].s = str;
        types[pos]    = 's';
        args[pos++].s = needle;
    }

    if(!*str || !strcmp(str, "/")) {
        ports = &root;
    } else {
        const Port *port = root.apropos(str);
        //fprintf(stderr, "apropos %s -> %s\n",str,port?port->name:"<no result>");
        if(port) {
            if(port->ports) {
                ports = port->ports;
            } else {
                single_port = port;
            }
        }
    }

    const auto fn = [&pos,&needle,&types,&args,&max](const Port& p)
    {
#ifdef NDEBUG
        (void)max;
#else
        assert(pos < max);
#endif
        //fprintf(stderr, "path search iterating port: %s (needle %s) (pos %d)\n", p.name, needle, (int)pos);
        if(p.name && strstr(p.name, needle) == p.name)
        {
            types[pos]    = 's';
            args[pos++].s = p.name;
            types[pos]    = 'b';
            if(p.metadata && *p.metadata) {
                args[pos].b.data = (unsigned char*) p.metadata;
                auto tmp = rtosc::Port::MetaContainer(p.metadata);
                args[pos++].b.len  = tmp.length();
            } else {
                args[pos].b.data = (unsigned char*) NULL;
                args[pos++].b.len  = 0;
            }
        }
    };

    if(ports)
        for(const Port &p:*ports) fn(p);
    else if(single_port)
        fn(*single_port);

    if (opts == path_search_opts::sorted ||
        opts == path_search_opts::sorted_and_unique_prefix)
    {
        // we could use std::array, but its internal array does not necessarily
        // have offset 0
        using val_on_2 = my_array<rtosc_arg_t, 2>;
        using ptr_on_2 = val_on_2*;
        auto is_less = [](const val_on_2 &p1, const val_on_2 &p2) -> bool {
            return strcmp(p1[0].s, p2[0].s) < 0;
        };
        std::size_t n_paths_found = pos >> 1;
        std::sort((ptr_on_2)args, ((ptr_on_2)(args))+n_paths_found, is_less);

        if (opts == path_search_opts::sorted_and_unique_prefix)
        {
            std::size_t prev_pos = 0;
            std::size_t strlen_prev = n_paths_found > 1 ? strlen(args[prev_pos].s) : 0;
            std::size_t unused_paths = 0;
            for(pos = 2; pos < (n_paths_found<<1); ++++pos)
            {
                assert(args[prev_pos].s); // invariant

                // is the prev path a (real) sub-path of this path?
                // i.e. the current can be accessed by recursing into the prev?
                if(strlen_prev < strlen(args[pos].s) &&
                   0 == strncmp(args[pos].s, args[prev_pos].s, strlen_prev) &&
                   args[prev_pos].s[strlen_prev-1] == '/')
                {
                    // then mark this as unused
                    args[pos].s = nullptr;
                    ++unused_paths;
                }
                else
                {
                    prev_pos = pos;
                    strlen_prev = strlen(args[prev_pos].s);
                }
            }

            // another sort, only to move unused paths to the end
            auto is_less_2 = [](const val_on_2 &p1, const val_on_2 &p2) -> bool {
                return (!(p1[0].s)) ? false // move p1 to the end
                                    : (!(p2[0].s)) ? true // move p2 to the end
                                                   // is actually already sorted:
                                                   : (strcmp(p1[0].s, p2[0].s) < 0);
            };
            std::sort((ptr_on_2)args, ((ptr_on_2)(args))+n_paths_found, is_less_2);

            // cut off unused paths
            types[(n_paths_found - unused_paths)<<1] = 0;
        }
    }
}